

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

void __thiscall HashTbl::Grow(HashTbl *this)

{
  int iVar1;
  uint bucketCount;
  uint32 uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  HashTbl *buckets;
  ulong uVar7;
  Ident *pIVar8;
  Ident *pIVar9;
  uint uVar10;
  HashTbl *this_00;
  uint uVar11;
  uint cb;
  
  uVar2 = this->m_luMask;
  iVar1 = uVar2 * 4;
  bucketCount = iVar1 + 4;
  if (POPCOUNT(bucketCount) != 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x42,"(n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1)))",
                       "n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1))");
    if (!bVar4) goto LAB_00e747de;
    *puVar6 = 0;
  }
  uVar10 = uVar2 + 1;
  cb = 0xffffffff;
  if (bucketCount < 0x20000000) {
    cb = uVar10 * 0x20;
  }
  if ((-1 < (int)cb && bucketCount < 0x20000000) &&
     (buckets = (HashTbl *)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,cb),
     buckets != (HashTbl *)0x0)) {
    uVar11 = iVar1 + 3;
    this_00 = buckets;
    memset(buckets,0,(ulong)cb);
    if (uVar10 != 0) {
      uVar7 = 0;
LAB_00e746e5:
      pIVar8 = this->m_prgpidName[uVar7];
      if (pIVar8 != (Ident *)0x0) goto LAB_00e74712;
      do {
        pIVar9 = pIVar8;
        pIVar8 = (Ident *)0x0;
        while( true ) {
          if (pIVar9 == (Ident *)0x0) {
            uVar7 = uVar7 + 1;
            if (uVar7 != uVar10) goto LAB_00e746e5;
            goto LAB_00e7471f;
          }
          this_00 = (HashTbl *)(ulong)(pIVar9->m_luHash & uVar11);
          pIVar9->m_pidNext = buckets->m_rpid[(long)&this_00[-1].stats];
          buckets->m_rpid[(long)&this_00[-1].stats] = pIVar9;
          if (pIVar8 == (Ident *)0x0) break;
LAB_00e74712:
          pIVar9 = pIVar8;
          pIVar8 = pIVar8->m_pidNext;
        }
      } while( true );
    }
LAB_00e7471f:
    uVar5 = CountAndVerifyItems(this_00,(IdentPtr *)buckets,bucketCount,uVar11);
    if (uVar5 != this->m_luCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                         ,0x60,
                         "(CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount)",
                         "CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount");
      if (!bVar4) {
LAB_00e747de:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    this->m_prgpidName = (Ident **)buckets;
    this->m_luMask = uVar11;
    if (this->stats != (DictionaryStats *)0x0) {
      if (bucketCount == 0) {
        uVar11 = 0;
      }
      else {
        uVar7 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 + (buckets->m_rpid[uVar7 - 8] == (IdentPtr)0x0);
          uVar7 = uVar7 + 1;
        } while (bucketCount != uVar7);
      }
      DictionaryStats::Resize(this->stats,bucketCount,uVar11);
      return;
    }
  }
  return;
}

Assistant:

void HashTbl::Grow()
{
    // Grow the bucket size by grow factor
    // Has the side-effect of inverting the order the pids appear in their respective buckets.
    uint cidHash = m_luMask + 1;
    uint n_cidHash = cidHash * GrowFactor;
    Assert(n_cidHash > 0 && 0 == (n_cidHash & (n_cidHash - 1)));

    // Win8 730594 - Use intsafe function to check for overflow.
    uint cbTemp;
    if (FAILED(UIntMult(n_cidHash, sizeof(Ident *), &cbTemp)) || cbTemp > LONG_MAX)
        // It is fine to exit early here, we will just have a potentially densely populated hash table
        return;
    int32 cb = cbTemp;
    uint n_luMask = n_cidHash - 1;

    IdentPtr *n_prgpidName = (IdentPtr *)m_noReleaseAllocator.Alloc(cb);
    if (n_prgpidName == nullptr)
        // It is fine to exit early here, we will just have a potentially densely populated hash table
        return;

    // Clear the array
    memset(n_prgpidName, 0, cb);

    // Place each entry its new bucket.
    for (uint i = 0; i < cidHash; i++)
    {
        for (IdentPtr pid = m_prgpidName[i], next = pid ? pid->m_pidNext : nullptr; pid; pid = next, next = pid ? pid->m_pidNext : nullptr)
        {
            uint32 luHash = pid->m_luHash;
            uint32 luIndex = luHash & n_luMask;
            pid->m_pidNext = n_prgpidName[luIndex];
            n_prgpidName[luIndex] = pid;
        }
    }

    Assert(CountAndVerifyItems(n_prgpidName, n_cidHash, n_luMask) == m_luCount);

    // Update the table fields.
    m_prgpidName = n_prgpidName;
    m_luMask= n_luMask;

#if PROFILE_DICTIONARY
    if(stats)
    {
        int emptyBuckets = 0;
        for (uint i = 0; i < n_cidHash; i++)
        {
            if(m_prgpidName[i] == nullptr)
            {
                emptyBuckets++;
            }
        }
        stats->Resize(n_cidHash, emptyBuckets);
    }
#endif
}